

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsidebar_p.cpp
# Opt level: O0

void QUrlModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int in_EDX;
  int in_ESI;
  QModelIndex *unaff_retaddr;
  QUrlModel *_t;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      dataChanged((QUrlModel *)_a,(QModelIndex *)_t,unaff_retaddr);
    }
    else if (in_EDX == 1) {
      layoutChanged(_t);
    }
  }
  return;
}

Assistant:

void QUrlModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QUrlModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 1: _t->layoutChanged(); break;
        default: ;
        }
    }
}